

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

int Llb4_Nonlin4SweepCutpoints(Aig_Man_t *pAig,Vec_Int_t *vOrder,int nBddLimit,int fVerbose)

{
  void *pvVar1;
  void *pvVar2;
  uint numVars;
  int iVar3;
  int iVar4;
  DdManager *dd_00;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  DdNode *pDVar7;
  DdNode *g;
  uint local_50;
  int Counter1;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  DdNode *bFunc;
  DdNode *bFunc1;
  DdNode *bFunc0;
  DdManager *dd;
  int fVerbose_local;
  int nBddLimit_local;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  
  local_50 = 0;
  numVars = Aig_ManObjNumMax(pAig);
  dd_00 = Cudd_Init(numVars,0,0x100,0x40000,0);
  Aig_ManCleanData(pAig);
  for (Counter1 = 0; iVar3 = Vec_PtrSize(pAig->vCis), Counter1 < iVar3; Counter1 = Counter1 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,Counter1);
    iVar3 = Llb_ObjBddVar(vOrder,pAVar5);
    pDVar7 = Cudd_bddIthVar(dd_00,iVar3);
    (pAVar5->field_5).pData = pDVar7;
  }
  for (Counter1 = 0; iVar3 = Vec_PtrSize(pAig->vObjs), Counter1 < iVar3; Counter1 = Counter1 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,Counter1);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar5), iVar3 != 0)) {
      pAVar6 = Aig_ObjFanin0(pAVar5);
      pvVar1 = (pAVar6->field_5).pData;
      iVar3 = Aig_ObjFaninC0(pAVar5);
      pDVar7 = (DdNode *)((ulong)pvVar1 ^ (long)iVar3);
      pAVar6 = Aig_ObjFanin1(pAVar5);
      pvVar1 = (pAVar6->field_5).pData;
      iVar3 = Aig_ObjFaninC1(pAVar5);
      g = (DdNode *)((ulong)pvVar1 ^ (long)iVar3);
      pObj = (Aig_Obj_t *)Cudd_bddAnd(dd_00,pDVar7,g);
      Cudd_Ref((DdNode *)pObj);
      iVar3 = Cudd_DagSize((DdNode *)pObj);
      if (nBddLimit < iVar3) {
        Cudd_RecursiveDeref(dd_00,(DdNode *)pObj);
        iVar3 = Cudd_DagSize(pDVar7);
        iVar4 = Cudd_DagSize(g);
        if (iVar3 < iVar4) {
          pAVar6 = Aig_ObjFanin1(pAVar5);
          Cudd_RecursiveDeref(dd_00,(DdNode *)(pAVar6->field_5).pData);
          pAVar6 = Aig_ObjFanin1(pAVar5);
          iVar3 = Llb_ObjBddVar(vOrder,pAVar6);
          pDVar7 = Cudd_bddIthVar(dd_00,iVar3);
          pAVar6 = Aig_ObjFanin1(pAVar5);
          (pAVar6->field_5).pData = pDVar7;
          Cudd_Ref(pDVar7);
          pAVar6 = Aig_ObjFanin1(pAVar5);
          *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef | 0x10;
        }
        else {
          pAVar6 = Aig_ObjFanin0(pAVar5);
          Cudd_RecursiveDeref(dd_00,(DdNode *)(pAVar6->field_5).pData);
          pAVar6 = Aig_ObjFanin0(pAVar5);
          iVar3 = Llb_ObjBddVar(vOrder,pAVar6);
          pDVar7 = Cudd_bddIthVar(dd_00,iVar3);
          pAVar6 = Aig_ObjFanin0(pAVar5);
          (pAVar6->field_5).pData = pDVar7;
          Cudd_Ref(pDVar7);
          pAVar6 = Aig_ObjFanin0(pAVar5);
          *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef | 0x10;
        }
        pAVar6 = Aig_ObjFanin0(pAVar5);
        pvVar1 = (pAVar6->field_5).pData;
        iVar3 = Aig_ObjFaninC0(pAVar5);
        pAVar6 = Aig_ObjFanin1(pAVar5);
        pvVar2 = (pAVar6->field_5).pData;
        iVar4 = Aig_ObjFaninC1(pAVar5);
        pObj = (Aig_Obj_t *)
               Cudd_bddAnd(dd_00,(DdNode *)((ulong)pvVar1 ^ (long)iVar3),
                           (DdNode *)((ulong)pvVar2 ^ (long)iVar4));
        Cudd_Ref((DdNode *)pObj);
        local_50 = local_50 + 1;
      }
      (pAVar5->field_5).pData = pObj;
    }
  }
  for (Counter1 = 0; iVar3 = Vec_PtrSize(pAig->vObjs), Counter1 < iVar3; Counter1 = Counter1 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,Counter1);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar5), iVar3 != 0)) {
      Cudd_RecursiveDeref(dd_00,(DdNode *)(pAVar5->field_5).pData);
    }
  }
  Extra_StopManager(dd_00);
  if (fVerbose != 0) {
    printf("Added %d cut points.  Used %d high fanout points.\n",(ulong)local_50,0);
  }
  return local_50;
}

Assistant:

int Llb4_Nonlin4SweepCutpoints( Aig_Man_t * pAig, Vec_Int_t * vOrder, int nBddLimit, int fVerbose )
{
    DdManager * dd;
    DdNode * bFunc0, * bFunc1, * bFunc;
    Aig_Obj_t * pObj;
    int i, Counter = 0, Counter1 = 0;
    dd = Cudd_Init( Aig_ManObjNumMax(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    // assign elementary variables
    Aig_ManCleanData( pAig );
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    // sweep internal nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
/*
        if ( pObj->nRefs >= 4 )
        {
            bFunc = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );  Cudd_Ref( bFunc );
            pObj->pData = bFunc;
            Counter1++;
            continue;
        }
*/
        bFunc0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bFunc1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );  Cudd_Ref( bFunc );
        if ( Cudd_DagSize(bFunc) > nBddLimit )
        {
//            if ( fVerbose )
//                printf( "Node %5d : Beg =%5d. ", i, Cudd_DagSize(bFunc) );

            // add cutpoint at a larger one
            Cudd_RecursiveDeref( dd, bFunc );
            if ( Cudd_DagSize(bFunc0) >= Cudd_DagSize(bFunc1) )
            {
                Cudd_RecursiveDeref( dd, (DdNode *)Aig_ObjFanin0(pObj)->pData );
                bFunc = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, Aig_ObjFanin0(pObj)) );
                Aig_ObjFanin0(pObj)->pData = bFunc;  Cudd_Ref( bFunc );
                Aig_ObjFanin0(pObj)->fMarkA = 1;

//                if ( fVerbose )
//                    printf( "Ref =%3d  ", Aig_ObjFanin0(pObj)->nRefs );
            }
            else
            {
                Cudd_RecursiveDeref( dd, (DdNode *)Aig_ObjFanin1(pObj)->pData );
                bFunc = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, Aig_ObjFanin1(pObj)) );
                Aig_ObjFanin1(pObj)->pData = bFunc;  Cudd_Ref( bFunc );
                Aig_ObjFanin1(pObj)->fMarkA = 1;

//                if ( fVerbose )
//                    printf( "Ref =%3d  ", Aig_ObjFanin1(pObj)->nRefs );
            }
            // perform new operation
            bFunc0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
            bFunc1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
            bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );  Cudd_Ref( bFunc );
//            assert( Cudd_DagSize(bFunc) <= nBddLimit );

//            if ( fVerbose )
//                printf( "End =%5d.\n", Cudd_DagSize(bFunc) );
            Counter++;
        }
        pObj->pData = bFunc;
//printf( "%d ", Cudd_DagSize(bFunc) );
    }
//printf( "\n" );
    // clean up
    Aig_ManForEachNode( pAig, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    Extra_StopManager( dd );
//    Aig_ManCleanMarkA( pAig );
    if ( fVerbose )
    printf( "Added %d cut points.  Used %d high fanout points.\n", Counter, Counter1 );
    return Counter + Counter1;
}